

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesSchedulerSetTimeoutMode
          (zes_sched_handle_t hScheduler,zes_sched_timeout_properties_t *pProperties,
          ze_bool_t *pNeedReload)

{
  zes_pfnSchedulerSetTimeoutMode_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnSchedulerSetTimeoutMode_t pfnSetTimeoutMode;
  ze_bool_t *pNeedReload_local;
  zes_sched_timeout_properties_t *pProperties_local;
  zes_sched_handle_t hScheduler_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Scheduler).pfnSetTimeoutMode;
    if (p_Var1 == (zes_pfnSchedulerSetTimeoutMode_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hScheduler_local._4_4_ = (*p_Var1)(hScheduler,pProperties,pNeedReload);
    }
  }
  else {
    hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hScheduler_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesSchedulerSetTimeoutMode(
    zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
    zes_sched_timeout_properties_t* pProperties,    ///< [in] The properties to use when configurating this mode.
    ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                    ///< apply the new scheduler mode.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnSchedulerSetTimeoutMode_t pfnSetTimeoutMode = [&result] {
        auto pfnSetTimeoutMode = ze_lib::context->zesDdiTable.load()->Scheduler.pfnSetTimeoutMode;
        if( nullptr == pfnSetTimeoutMode ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetTimeoutMode;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetTimeoutMode( hScheduler, pProperties, pNeedReload );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetTimeoutMode = ze_lib::context->zesDdiTable.load()->Scheduler.pfnSetTimeoutMode;
    if( nullptr == pfnSetTimeoutMode ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetTimeoutMode( hScheduler, pProperties, pNeedReload );
    #endif
}